

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_seckey_negate(secp256k1_context *ctx,uchar *seckey)

{
  uint uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  unsigned_long _zzq_result;
  int vflag;
  unsigned_long _zzq_args [6];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_ec_seckey_negate_cold_2();
  }
  else if (seckey != (uchar *)0x0) {
    uVar1 = secp256k1_scalar_set_b32_seckey((secp256k1_scalar *)local_58,seckey);
    secp256k1_scalar_verify(&secp256k1_scalar_zero);
    lVar2 = (long)(int)(uVar1 ^ 1) + -1;
    auVar3._8_4_ = (int)lVar2;
    auVar3._0_8_ = lVar2;
    auVar3._12_4_ = (int)((ulong)lVar2 >> 0x20);
    local_58 = local_58 & auVar3;
    local_48 = auVar3 & local_48;
    secp256k1_scalar_verify((secp256k1_scalar *)local_58);
    secp256k1_scalar_negate((secp256k1_scalar *)local_58,(secp256k1_scalar *)local_58);
    secp256k1_scalar_get_b32(seckey,(secp256k1_scalar *)local_58);
    return uVar1;
  }
  secp256k1_ec_seckey_negate_cold_1();
  return 0;
}

Assistant:

int secp256k1_ec_seckey_negate(const secp256k1_context* ctx, unsigned char *seckey) {
    secp256k1_scalar sec;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_negate(&sec, &sec);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    return ret;
}